

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_test.cpp
# Opt level: O3

int main(void)

{
  unique_ptr<int,_std::default_delete<int>_> uVar1;
  long lVar2;
  char *pcVar3;
  
  pthread_once(&Singleton<int>::m_once,Singleton<int>::init);
  uVar1 = Singleton<int>::m_ptInstance;
  pthread_once(&Singleton<int>::m_once,Singleton<int>::init);
  if (uVar1._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl ==
      Singleton<int>::m_ptInstance._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl) {
    pcVar3 = "Singleton True";
    lVar2 = 0xe;
  }
  else {
    pcVar3 = "Singleton False";
    lVar2 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	int & a = Singleton<int>::GetInstance();
	int & b = Singleton<int>::GetInstance();
	
	if ((&a) == (&b))
	{
		cout << "Singleton True" << endl;
	}
	else
	{
		cout << "Singleton False" << endl;
	}
}